

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_interpreter_analyzeAndEvaluateSourceCodeWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t sourceCode)

{
  sysbvm_tuple_t string;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_tuple_t *psStack_40;
  sysbvm_tuple_t local_38;
  sysbvm_tuple_t local_30;
  sysbvm_tuple_t local_28;
  sysbvm_tuple_t sStack_20;
  
  psStack_40 = &local_38;
  local_28 = 0;
  sStack_20 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 4;
  local_38 = environment;
  local_30 = sourceCode;
  sysbvm_stackFrame_pushRecord(&local_58);
  string = sysbvm_sourceCode_getLanguage(local_30);
  sysbvm_string_equalsCString(string,"sysmel");
  local_28 = sysbvm_parser_parseSourceCode(context,local_30);
  sStack_20 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,local_28,local_38);
  sysbvm_stackFrame_popRecord(&local_58);
  return sStack_20;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_analyzeAndEvaluateSourceCodeWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t sourceCode)
{
    struct {
        sysbvm_tuple_t environment;
        sysbvm_tuple_t sourceCode;
        sysbvm_tuple_t ast;
        sysbvm_tuple_t result;
    } gcFrame = {
        .environment = environment,
        .sourceCode = sourceCode
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    if(sysbvm_string_equalsCString(sysbvm_sourceCode_getLanguage(gcFrame.sourceCode), "sysmel"))
        gcFrame.ast = sysbvm_parser_parseSourceCode(context, gcFrame.sourceCode);
    else
        gcFrame.ast = sysbvm_parser_parseSourceCode(context, gcFrame.sourceCode);
    gcFrame.result = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.ast, gcFrame.environment);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}